

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermConstantUnion::fold(TIntermConstantUnion *this,TOperator op,TType *returnType)

{
  double dVar1;
  pointer pTVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong *puVar8;
  pointer pcVar9;
  pointer pcVar10;
  TPoolAllocator *this_00;
  TIntermTyped *pTVar11;
  TType *pTVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  double *pdVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  ulong uVar21;
  TConstUnion TVar22;
  TConstUnionArray newConstArray;
  TConstUnionArray local_90;
  double local_80;
  long local_78;
  double local_70;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  TType *local_48;
  uint local_3c;
  ulong local_38;
  
  iVar5 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  uVar6 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar5));
  uVar14 = op - EOpPackSnorm2x16;
  uVar17 = (ulong)uVar14;
  uVar16 = 1;
  if (uVar14 < 0x3b) {
    if ((0x10fc000000U >> (uVar17 & 0x3f) & 1) == 0) {
      bVar3 = false;
      if ((0x400000100000105U >> (uVar17 & 0x3f) & 1) == 0) {
        if ((0x20aUL >> (uVar17 & 0x3f) & 1) == 0) goto LAB_003e9b97;
        uVar16 = 2;
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
      uVar16 = uVar6;
    }
  }
  else {
LAB_003e9b97:
    if (op - EOpEmitStreamVertex < 2) {
      return (TIntermTyped *)0x0;
    }
    bVar3 = false;
    if (1 < op - EOpAny) {
      bVar3 = true;
      uVar16 = uVar6;
    }
  }
  TConstUnionArray::TConstUnionArray(&local_90,uVar16);
  local_48 = returnType;
  if (uVar14 < 0x3d) {
    if ((0x1c000000fc00030fU >> (uVar17 & 0x3f) & 1) != 0) {
LAB_003ea9e4:
      return (TIntermTyped *)0x0;
    }
    if ((0x1100000000U >> (uVar17 & 0x3f) & 1) == 0) goto LAB_003e9c0e;
    dVar20 = 0.0;
    if (0 < (int)uVar6) {
      lVar15 = 0;
      do {
        dVar1 = *(double *)
                 ((long)&((((this->constArray).unionArray)->
                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ).
                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
        dVar20 = dVar20 + dVar1 * dVar1;
        lVar15 = lVar15 + 0x10;
      } while ((ulong)uVar6 << 4 != lVar15);
    }
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    if (op == EOpLength) {
      pdVar13 = (double *)
                ((_Alloc_hider *)
                &(local_90.unionArray)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                ->_M_p;
      *pdVar13 = dVar20;
      uVar7 = 2;
      goto LAB_003e9d3b;
    }
    if (0 < (int)uVar6) {
      lVar15 = 0;
      do {
        pcVar9 = ((_Alloc_hider *)
                 &(local_90.unionArray)->
                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 )->_M_p;
        *(double *)(pcVar9 + lVar15) =
             *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) / dVar20;
        pcVar9 = pcVar9 + lVar15 + 8;
        pcVar9[0] = '\x02';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        lVar15 = lVar15 + 0x10;
      } while ((ulong)uVar6 << 4 != lVar15);
    }
  }
  else {
LAB_003e9c0e:
    if (op == EOpAny) {
      if ((int)uVar6 < 1) {
        cVar4 = '\0';
      }
      else {
        lVar15 = 0;
        cVar4 = '\0';
        do {
          if (*(char *)((long)&((((this->constArray).unionArray)->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) !=
              '\0') {
            cVar4 = '\x01';
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)uVar6 << 4 != lVar15);
      }
    }
    else {
      if (op != EOpAll) {
        if (!bVar3) {
          __assert_fail("componentWise",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                        ,0x1e3,
                        "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                       );
        }
        goto LAB_003e9d3e;
      }
      if ((int)uVar6 < 1) {
        cVar4 = '\x01';
      }
      else {
        cVar4 = '\x01';
        lVar15 = 0;
        do {
          if (*(char *)((long)&((((this->constArray).unionArray)->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) ==
              '\0') {
            cVar4 = '\0';
          }
          lVar15 = lVar15 + 0x10;
        } while ((ulong)uVar6 << 4 != lVar15);
      }
    }
    pdVar13 = (double *)
              ((_Alloc_hider *)
              &(local_90.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
              _M_p;
    *(char *)pdVar13 = cVar4;
    uVar7 = 0xc;
LAB_003e9d3b:
    *(undefined4 *)(pdVar13 + 1) = uVar7;
  }
LAB_003e9d3e:
  if (!bVar3 || (int)uVar6 < 1) {
LAB_003ea95c:
    this_00 = GetThreadPoolAllocator();
    pTVar11 = (TIntermTyped *)TPoolAllocator::allocate(this_00,0xd0);
    TIntermTyped::TIntermTyped(pTVar11,local_48);
    (pTVar11->super_TIntermNode)._vptr_TIntermNode = (_func_int **)&PTR_getLoc_00941a00;
    pTVar11[1].super_TIntermNode._vptr_TIntermNode = (_func_int **)&PTR__TConstUnionArray_0093b5a8;
    pTVar11[1].super_TIntermNode.loc.name = (TString *)local_90.unionArray;
    *(undefined1 *)&pTVar11[1].super_TIntermNode.loc.string = 0;
    pTVar12 = TIntermTyped::getWritableType(pTVar11);
    iVar5 = (*pTVar12->_vptr_TType[10])(pTVar12);
    *(ulong *)(CONCAT44(extraout_var_03,iVar5) + 8) =
         *(ulong *)(CONCAT44(extraout_var_03,iVar5) + 8) & 0xffffffffffffff80 | 2;
    iVar5 = (**(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(this);
    (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[1])(pTVar11,CONCAT44(extraout_var_04,iVar5));
    return pTVar11;
  }
  if ((int)op < 0x48) {
    if (0x38 < op - EOpNegative) {
      return (TIntermTyped *)0x0;
    }
    if ((0x1fe000000001c0fU >> ((ulong)(op - EOpNegative) & 0x3f) & 1) == 0) {
      return (TIntermTyped *)0x0;
    }
  }
  else if ((((0x16 < op - EOpExp) || ((0x603fffU >> (op - EOpExp & 0x1f) & 1) == 0)) &&
           (8 < op - EOpDPdx)) && (op != EOpConstructReference)) {
    return (TIntermTyped *)0x0;
  }
  local_38 = (ulong)uVar6;
  uVar18 = 1;
  local_3c = op - EOpDPdx;
  uVar17 = (ulong)(op - EOpNegative);
  lVar15 = 0;
  local_68 = uVar17;
LAB_003e9dd4:
  switch(op) {
  case EOpRadians:
    pcVar10 = ((_Alloc_hider *)
              &(local_90.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
              _M_p;
    dVar20 = (*(double *)
               ((long)&((((this->constArray).unionArray)->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) *
             3.141592653589793) / 180.0;
    goto LAB_003ea83a;
  case EOpDegrees:
    pcVar10 = ((_Alloc_hider *)
              &(local_90.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
              _M_p;
    dVar20 = (*(double *)
               ((long)&((((this->constArray).unionArray)->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) * 180.0) /
             3.141592653589793;
    goto LAB_003ea83a;
  case EOpSin:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = sin(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpCos:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = cos(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpTan:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = tan(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpAsin:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = asin(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpAcos:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = acos(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpAtan:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = atan(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpSinh:
  case EOpCosh:
  case EOpTanh:
  case EOpAsinh:
  case EOpAcosh:
  case EOpAtanh:
  case EOpPow:
  case EOpModf:
  case EOpMin:
  case EOpMax:
  case EOpClamp:
  case EOpMix:
  case EOpStep:
  case EOpSmoothStep:
    goto switchD_003e9de8_caseD_41;
  case EOpExp:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = exp(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpLog:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = log(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpExp2:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = exp2(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpLog2:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = log2(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    break;
  case EOpSqrt:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    break;
  case EOpInverseSqrt:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    dVar20 = 1.0 / dVar20;
    goto LAB_003ea3b4;
  case EOpAbs:
    pTVar2 = (((this->constArray).unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = *(int *)((long)&pTVar2->type + lVar15);
    puVar8 = (ulong *)((long)&pTVar2->field_0 + lVar15);
    if (iVar5 == 8) {
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      uVar16 = (uint)*puVar8;
      uVar14 = -uVar16;
      if (0 < (int)uVar16) {
        uVar14 = uVar16;
      }
LAB_003ea438:
      *(uint *)(pcVar9 + lVar15) = uVar14;
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\b';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      goto LAB_003ea847;
    }
    if (iVar5 != 2) {
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(int *)(pcVar9 + lVar15 + 8) = (int)puVar8[1];
      *(ulong *)(pcVar9 + lVar15) = *puVar8;
      goto LAB_003ea847;
    }
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    uVar21 = *puVar8 & 0x7fffffffffffffff;
    goto LAB_003ea255;
  case EOpSign:
    pTVar2 = (((this->constArray).unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)&pTVar2->type + lVar15) != 2) {
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      iVar5 = *(int *)((long)&pTVar2->field_0 + lVar15);
      uVar14 = iVar5 >> 0x1f | 1;
      if (iVar5 == 0) {
        uVar14 = 0;
      }
      goto LAB_003ea438;
    }
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)((long)&pTVar2->field_0 + lVar15);
    uVar21 = ~-(ulong)(dVar20 == 0.0) & *(ulong *)(&DAT_0071a4b0 + (ulong)(dVar20 < 0.0) * 8);
LAB_003ea255:
    *(ulong *)(pcVar9 + lVar15) = uVar21;
    pcVar9 = pcVar9 + lVar15 + 8;
    pcVar9[0] = '\x02';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    goto LAB_003ea847;
  case EOpFloor:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    goto LAB_003ea314;
  case EOpTrunc:
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    if (dVar20 <= 0.0) {
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      goto LAB_003ea3c5;
    }
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    goto LAB_003ea314;
  case EOpRound:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) + 0.5;
LAB_003ea314:
    dVar20 = floor(dVar20);
    break;
  case EOpRoundEven:
    local_70 = *(double *)
                ((long)&((((this->constArray).unionArray)->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    local_80 = floor(local_70);
    local_80 = local_80 * 0.5;
    dVar20 = floor(local_80);
    if ((local_80 != dVar20) || (NAN(local_80) || NAN(dVar20))) {
      dVar20 = floor(local_70 + 0.5);
    }
    else {
      dVar20 = ceil(local_70 + -0.5);
    }
    pcVar10 = ((_Alloc_hider *)
              &(local_90.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
              _M_p;
LAB_003ea83a:
    *(double *)(pcVar10 + lVar15) = dVar20;
LAB_003ea83f:
    pcVar10 = pcVar10 + lVar15 + 8;
    pcVar10[0] = '\x02';
    pcVar10[1] = '\0';
    pcVar10[2] = '\0';
    pcVar10[3] = '\0';
    goto LAB_003ea847;
  case EOpCeil:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
LAB_003ea3c5:
    dVar20 = ceil(dVar20);
    break;
  case EOpFract:
    local_70 = *(double *)
                ((long)&((((this->constArray).unionArray)->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    dVar20 = floor(local_70);
    dVar20 = local_70 - dVar20;
LAB_003ea3b4:
    *(double *)(pcVar9 + lVar15) = dVar20;
    goto LAB_003ea3f2;
  case EOpIsNan:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    pcVar9[lVar15] =
         NAN(*(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
    goto LAB_003ea1b3;
  case EOpIsInf:
    pcVar9 = ((_Alloc_hider *)
             &(local_90.unionArray)->
              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)->
             _M_p;
    pcVar9[lVar15] =
         (*(ulong *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) &
         0x7fffffffffffffff) == 0x7ff0000000000000;
LAB_003ea1b3:
    pcVar9 = pcVar9 + lVar15 + 8;
    pcVar9[0] = '\f';
    pcVar9[1] = '\0';
    pcVar9[2] = '\0';
    pcVar9[3] = '\0';
    goto LAB_003ea847;
  default:
    if (local_3c < 9) {
      pcVar10 = ((_Alloc_hider *)
                &(local_90.unionArray)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                ->_M_p;
      pcVar9 = pcVar10 + lVar15;
      pcVar9[0] = '\0';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      goto LAB_003ea83f;
    }
    if (10 < (uint)uVar17) {
switchD_003e9de8_caseD_41:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(undefined8 *)(pcVar9 + lVar15) =
           *(undefined8 *)
            ((long)&((((this->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
LAB_003ea396:
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\v';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      goto LAB_003ea847;
    }
    switch((long)&switchD_003e9e4d::switchdataD_00719e74 +
           (long)(int)(&switchD_003e9e4d::switchdataD_00719e74)[uVar17]) {
    case 0x3e9e4f:
      iVar5 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
      iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar5));
      if (iVar5 != 0xc) {
        return (TIntermTyped *)0x0;
      }
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      pcVar9[lVar15] =
           *(byte *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) ^ 1;
      goto LAB_003ea1b3;
    case 0x3e9eea:
      TVar22 = TConstUnion::operator~
                         ((TConstUnion *)
                          ((long)&((((this->constArray).unionArray)->
                                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ).
                                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15));
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      ((anon_union_8_11_a9b10978_for_TConstUnion_0 *)(pcVar9 + lVar15))->i64Const =
           (longlong)TVar22.field_0;
      *(TBasicType *)(pcVar9 + lVar15 + 8) = TVar22.type;
      goto LAB_003ea847;
    case 0x3e9f13:
      iVar5 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
      uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x38))
                        ((long *)CONCAT44(extraout_var_02,iVar5));
      switch(uVar7) {
      case 1:
      case 2:
      case 3:
        local_58 = *(undefined8 *)
                    ((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
        local_70 = 0.0;
        local_80 = 0.0;
        goto LAB_003ea68f;
      case 4:
        local_78 = (long)*(char *)((long)&((((this->constArray).unionArray)->
                                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                           ).
                                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->field_0 +
                                  lVar15);
        break;
      case 5:
        local_80 = (double)(ulong)*(byte *)((long)&((((this->constArray).unionArray)->
                                                                                                        
                                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                                  ).
                                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  field_0 + lVar15);
        goto LAB_003ea676;
      case 6:
        local_78 = (long)*(short *)((long)&((((this->constArray).unionArray)->
                                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ).
                                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->field_0 +
                                   lVar15);
        break;
      case 7:
        local_80 = (double)(ulong)*(ushort *)
                                   ((long)&((((this->constArray).unionArray)->
                                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ).
                                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->field_0 +
                                   lVar15);
        goto LAB_003ea676;
      case 8:
        local_78 = (long)*(int *)((long)&((((this->constArray).unionArray)->
                                          super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                          ).
                                          super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->field_0 +
                                 lVar15);
        break;
      case 9:
        local_80 = (double)(ulong)*(uint *)((long)&((((this->constArray).unionArray)->
                                                                                                        
                                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                                  ).
                                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  field_0 + lVar15);
        goto LAB_003ea676;
      case 10:
        local_78 = *(long *)((long)&((((this->constArray).unionArray)->
                                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                     ).
                                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
        break;
      case 0xb:
        local_80 = *(double *)
                    ((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
LAB_003ea676:
        local_58 = 0;
        local_70 = 9.88131291682493e-324;
LAB_003ea68f:
        local_78 = 0;
        goto LAB_003ea698;
      case 0xc:
        pTVar2 = (((this->constArray).unionArray)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                 .
                 super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_60 = CONCAT71((int7)((ulong)pTVar2 >> 8),
                            *(undefined1 *)((long)&pTVar2->field_0 + lVar15));
        local_58 = 0;
        local_70 = 1.48219693752374e-323;
        local_80 = 0.0;
        local_78 = 0;
        goto LAB_003ea6a1;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x223,
                      "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                     );
      }
      local_58 = 0;
      local_70 = 4.94065645841247e-324;
      local_80 = 0.0;
LAB_003ea698:
      local_60 = 0;
LAB_003ea6a1:
      uStack_50 = 0;
      iVar5 = (*local_48->_vptr_TType[7])();
      uVar14 = iVar5 - 1;
      if (0xb < uVar14) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x23d,
                      "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                     );
      }
      if ((0x800U >> (uVar14 & 0x1f) & 1) != 0) {
        pTVar11 = (TIntermTyped *)
                  (*(code *)(&DAT_00719fc4 +
                            *(int *)(&DAT_00719fc4 + ((ulong)local_70 & 0xffffffff) * 4)))();
        return pTVar11;
      }
      if ((7U >> (uVar14 & 0x1f) & 1) != 0) {
        pTVar11 = (TIntermTyped *)
                  (*(code *)(&DAT_00719fb4 +
                            *(int *)(&DAT_00719fb4 + ((ulong)local_70 & 0xffffffff) * 4)))();
        return pTVar11;
      }
      if ((0x2a8U >> ((byte)uVar14 & 0x1f) & 1) == 0) {
        pTVar11 = (TIntermTyped *)
                  (*(code *)(&DAT_00719f94 +
                            *(int *)(&DAT_00719f94 + ((ulong)local_70 & 0xffffffff) * 4)))();
        return pTVar11;
      }
      pTVar11 = (TIntermTyped *)
                (*(code *)(&DAT_00719fa4 +
                          *(int *)(&DAT_00719fa4 + ((ulong)local_70 & 0xffffffff) * 4)))();
      return pTVar11;
    case 0x3ea37a:
      goto switchD_003e9de8_caseD_41;
    }
    iVar5 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x38))
                      ((long *)CONCAT44(extraout_var_01,iVar5));
    switch(uVar7) {
    case 1:
    case 2:
    case 3:
      pcVar10 = ((_Alloc_hider *)
                &(local_90.unionArray)->
                 super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
                ->_M_p;
      *(ulong *)(pcVar10 + lVar15) =
           *(ulong *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15) ^
           0x8000000000000000;
      goto LAB_003ea83f;
    case 4:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      pcVar9[lVar15] =
           -*(char *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\x04';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 5:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      pcVar9[lVar15] =
           -*(char *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\x05';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 6:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(short *)(pcVar9 + lVar15) =
           -*(short *)((long)&((((this->constArray).unionArray)->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\x06';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 7:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(short *)(pcVar9 + lVar15) =
           -*(short *)((long)&((((this->constArray).unionArray)->
                               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ).
                               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                               ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\a';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 8:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(int *)(pcVar9 + lVar15) =
           -*(int *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\b';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 9:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(int *)(pcVar9 + lVar15) =
           -*(int *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\t';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 10:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(long *)(pcVar9 + lVar15) =
           -*(long *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      pcVar9 = pcVar9 + lVar15 + 8;
      pcVar9[0] = '\n';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      break;
    case 0xb:
      pcVar9 = ((_Alloc_hider *)
               &(local_90.unionArray)->
                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>)
               ->_M_p;
      *(long *)(pcVar9 + lVar15) =
           -*(long *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar15);
      goto LAB_003ea396;
    default:
      goto LAB_003ea9e4;
    }
    goto LAB_003ea847;
  }
  *(double *)(pcVar9 + lVar15) = dVar20;
LAB_003ea3f2:
  pcVar9 = pcVar9 + lVar15 + 8;
  pcVar9[0] = '\x02';
  pcVar9[1] = '\0';
  pcVar9[2] = '\0';
  pcVar9[3] = '\0';
  uVar17 = local_68;
LAB_003ea847:
  bVar19 = uVar18 < local_38;
  lVar15 = lVar15 + 0x10;
  uVar18 = uVar18 + 1;
  if (!(bool)(bVar3 & bVar19)) goto LAB_003ea95c;
  goto LAB_003e9dd4;
}

Assistant:

TIntermTyped* TIntermConstantUnion::fold(TOperator op, const TType& returnType) const
{
    // First, size the result, which is mostly the same as the argument's size,
    // but not always, and classify what is componentwise.
    // Also, eliminate cases that can't be compile-time constant.
    int resultSize;
    bool componentWise = true;

    int objectSize = getType().computeNumComponents();
    switch (op) {
    case EOpDeterminant:
    case EOpAny:
    case EOpAll:
    case EOpLength:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpEmitStreamVertex:
    case EOpEndStreamPrimitive:
        // These don't fold
        return nullptr;

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:
        componentWise = false;
        resultSize = 2;
        break;

    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:
    case EOpNormalize:
        componentWise = false;
        resultSize = objectSize;
        break;

    default:
        resultSize = objectSize;
        break;
    }

    // Set up for processing
    TConstUnionArray newConstArray(resultSize);
    const TConstUnionArray& unionArray = getConstArray();

    // Process non-component-wise operations
    switch (op) {
    case EOpLength:
    case EOpNormalize:
    {
        double sum = 0;
        for (int i = 0; i < objectSize; i++)
            sum += unionArray[i].getDConst() * unionArray[i].getDConst();
        double length = sqrt(sum);
        if (op == EOpLength)
            newConstArray[0].setDConst(length);
        else {
            for (int i = 0; i < objectSize; i++)
                newConstArray[i].setDConst(unionArray[i].getDConst() / length);
        }
        break;
    }

    case EOpAny:
    {
        bool result = false;
        for (int i = 0; i < objectSize; i++) {
            if (unionArray[i].getBConst())
                result = true;
        }
        newConstArray[0].setBConst(result);
        break;
    }
    case EOpAll:
    {
        bool result = true;
        for (int i = 0; i < objectSize; i++) {
            if (! unionArray[i].getBConst())
                result = false;
        }
        newConstArray[0].setBConst(result);
        break;
    }

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:

    case EOpDeterminant:
    case EOpMatrixInverse:
    case EOpTranspose:
        return nullptr;

    default:
        assert(componentWise);
        break;
    }

    // Turn off the componentwise loop
    if (! componentWise)
        objectSize = 0;

    // Process component-wise operations
    for (int i = 0; i < objectSize; i++) {
        // First read the value and convert to i64/u64/f64/bool, then convert
        // to the destination type (still 64b), then convert down to the
        // destination size.
        if (IsOpNumericConv(op)) {
            enum ConvType { CONV_FLOAT, CONV_INT, CONV_UINT, CONV_BOOL };
            ConvType srcType = CONV_UINT, dstType = CONV_UINT;
            double valf = 0.0;
            uint64_t valu = 0;
            int64_t vali = 0;
            bool valb = false;
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                valf = unionArray[i].getDConst();
                srcType = CONV_FLOAT;
                break;
            case EbtInt8:
                vali = unionArray[i].getI8Const();
                srcType = CONV_INT;
                break;
            case EbtInt16:
                vali = unionArray[i].getI16Const();
                srcType = CONV_INT;
                break;
            case EbtInt:
                vali = unionArray[i].getIConst();
                srcType = CONV_INT;
                break;
            case EbtInt64:
                vali = unionArray[i].getI64Const();
                srcType = CONV_INT;
                break;
            case EbtUint8:
                valu = unionArray[i].getU8Const();
                srcType = CONV_UINT;
                break;
            case EbtUint16:
                valu = unionArray[i].getU16Const();
                srcType = CONV_UINT;
                break;
            case EbtUint:
                valu = unionArray[i].getUConst();
                srcType = CONV_UINT;
                break;
            case EbtUint64:
                valu = unionArray[i].getU64Const();
                srcType = CONV_UINT;
                break;
            case EbtBool:
                valb = unionArray[i].getBConst();
                srcType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }

            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                dstType = CONV_FLOAT;
                break;
            case EbtInt8:
            case EbtInt16:
            case EbtInt:
            case EbtInt64:
                dstType = CONV_INT;
                break;
            case EbtUint8:
            case EbtUint16:
            case EbtUint:
            case EbtUint64:
                dstType = CONV_UINT;
                break;
            case EbtBool:
                dstType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }
            if (dstType == CONV_BOOL) {
                switch (srcType) {
                case CONV_FLOAT:
                    valb = (valf != 0.0); break;
                case CONV_INT:
                    valb = (vali != 0.0); break;
                case CONV_UINT:
                    valb = (valu != 0.0); break;
                default:
                    break;
                }
            } else if (dstType == CONV_FLOAT) {
                switch (srcType) {
                case CONV_BOOL:
                    valf = (double)valb; break;
                case CONV_INT:
                    valf = (double)vali; break;
                case CONV_UINT:
                    valf = (double)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_INT) {
                switch (srcType) {
                case CONV_BOOL:
                    vali = (int64_t)valb; break;
                case CONV_FLOAT:
                    vali = (int64_t)valf; break;
                case CONV_UINT:
                    vali = (int64_t)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_UINT) {
                switch (srcType) {
                case CONV_BOOL:
                    valu = (uint64_t)valb; break;
                case CONV_FLOAT:
                    valu = (uint64_t)valf; break;
                case CONV_INT:
                    valu = (uint64_t)vali; break;
                default:
                    break;
                }
            }
            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                newConstArray[i].setDConst(valf); break;
            case EbtInt8:
                newConstArray[i].setI8Const(static_cast<int8_t>(vali)); break;
            case EbtInt16:
                newConstArray[i].setI16Const(static_cast<int16_t>(vali)); break;
            case EbtInt:
                newConstArray[i].setIConst(static_cast<int32_t>(vali)); break;
            case EbtInt64:
                newConstArray[i].setI64Const(vali); break;
            case EbtUint8:
                newConstArray[i].setU8Const(static_cast<uint8_t>(valu)); break;
            case EbtUint16:
                newConstArray[i].setU16Const(static_cast<uint16_t>(valu)); break;
            case EbtUint:
                newConstArray[i].setUConst(static_cast<uint32_t>(valu)); break;
            case EbtUint64:
                newConstArray[i].setU64Const(valu); break;
            case EbtBool:
                newConstArray[i].setBConst(valb); break;
            default:
                assert(0);
                break;
            }
            continue;
        }
        switch (op) {
        case EOpNegative:
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat: newConstArray[i].setDConst(-unionArray[i].getDConst()); break;
            // Note: avoid UBSAN error regarding negating 0x80000000
            case EbtInt:   newConstArray[i].setIConst(
                                static_cast<unsigned int>(unionArray[i].getIConst()) == 0x80000000
                                    ? -0x7FFFFFFF - 1
                                    : -unionArray[i].getIConst());
                           break;
            case EbtUint:  newConstArray[i].setUConst(static_cast<unsigned int>(-static_cast<int>(unionArray[i].getUConst())));  break;
            case EbtInt8:  newConstArray[i].setI8Const(-unionArray[i].getI8Const()); break;
            case EbtUint8: newConstArray[i].setU8Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU8Const())));  break;
            case EbtInt16: newConstArray[i].setI16Const(-unionArray[i].getI16Const()); break;
            case EbtUint16:newConstArray[i].setU16Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU16Const())));  break;
            case EbtInt64: {
                int64_t i64val = unionArray[i].getI64Const();
                newConstArray[i].setI64Const(i64val == INT64_MIN ? INT64_MIN : -i64val);
                break;
            }
            case EbtUint64: newConstArray[i].setU64Const(static_cast<unsigned long long>(-static_cast<long long>(unionArray[i].getU64Const())));  break;
            default:
                return nullptr;
            }
            break;
        case EOpLogicalNot:
        case EOpVectorLogicalNot:
            switch (getType().getBasicType()) {
            case EbtBool:  newConstArray[i].setBConst(!unionArray[i].getBConst()); break;
            default:
                return nullptr;
            }
            break;
        case EOpBitwiseNot:
            newConstArray[i] = ~unionArray[i];
            break;
        case EOpRadians:
            newConstArray[i].setDConst(unionArray[i].getDConst() * pi / 180.0);
            break;
        case EOpDegrees:
            newConstArray[i].setDConst(unionArray[i].getDConst() * 180.0 / pi);
            break;
        case EOpSin:
            newConstArray[i].setDConst(sin(unionArray[i].getDConst()));
            break;
        case EOpCos:
            newConstArray[i].setDConst(cos(unionArray[i].getDConst()));
            break;
        case EOpTan:
            newConstArray[i].setDConst(tan(unionArray[i].getDConst()));
            break;
        case EOpAsin:
            newConstArray[i].setDConst(asin(unionArray[i].getDConst()));
            break;
        case EOpAcos:
            newConstArray[i].setDConst(acos(unionArray[i].getDConst()));
            break;
        case EOpAtan:
            newConstArray[i].setDConst(atan(unionArray[i].getDConst()));
            break;

        case EOpDPdx:
        case EOpDPdy:
        case EOpFwidth:
        case EOpDPdxFine:
        case EOpDPdyFine:
        case EOpFwidthFine:
        case EOpDPdxCoarse:
        case EOpDPdyCoarse:
        case EOpFwidthCoarse:
            // The derivatives are all mandated to create a constant 0.
            newConstArray[i].setDConst(0.0);
            break;

        case EOpExp:
            newConstArray[i].setDConst(exp(unionArray[i].getDConst()));
            break;
        case EOpLog:
            newConstArray[i].setDConst(log(unionArray[i].getDConst()));
            break;
        case EOpExp2:
            newConstArray[i].setDConst(exp2(unionArray[i].getDConst()));
            break;
        case EOpLog2:
            newConstArray[i].setDConst(log2(unionArray[i].getDConst()));
            break;
        case EOpSqrt:
            newConstArray[i].setDConst(sqrt(unionArray[i].getDConst()));
            break;
        case EOpInverseSqrt:
            newConstArray[i].setDConst(1.0 / sqrt(unionArray[i].getDConst()));
            break;

        case EOpAbs:
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(fabs(unionArray[i].getDConst()));
            else if (unionArray[i].getType() == EbtInt)
                newConstArray[i].setIConst(abs(unionArray[i].getIConst()));
            else
                newConstArray[i] = unionArray[i];
            break;
        case EOpSign:
            #define SIGN(X) (X == 0 ? 0 : (X < 0 ? -1 : 1))
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(SIGN(unionArray[i].getDConst()));
            else
                newConstArray[i].setIConst(SIGN(unionArray[i].getIConst()));
            break;
        case EOpFloor:
            newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            break;
        case EOpTrunc:
            if (unionArray[i].getDConst() > 0)
                newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            else
                newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpRound:
            newConstArray[i].setDConst(floor(0.5 + unionArray[i].getDConst()));
            break;
        case EOpRoundEven:
        {
            double flr = floor(unionArray[i].getDConst());
            bool even = flr / 2.0 == floor(flr / 2.0);
            double rounded = even ? ceil(unionArray[i].getDConst() - 0.5) : floor(unionArray[i].getDConst() + 0.5);
            newConstArray[i].setDConst(rounded);
            break;
        }
        case EOpCeil:
            newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpFract:
        {
            double x = unionArray[i].getDConst();
            newConstArray[i].setDConst(x - floor(x));
            break;
        }

        case EOpIsNan:
        {
            newConstArray[i].setBConst(std::isnan(unionArray[i].getDConst()));
            break;
        }
        case EOpIsInf:
        {
            newConstArray[i].setBConst(std::isinf(unionArray[i].getDConst()));
            break;
        }

        case EOpConvPtrToUint64:
        case EOpConvUint64ToPtr:
        case EOpConstructReference:
            newConstArray[i].setU64Const(unionArray[i].getU64Const()); break;

        // TODO: 3.0 Functionality: unary constant folding: the rest of the ops have to be fleshed out

        case EOpSinh:
        case EOpCosh:
        case EOpTanh:
        case EOpAsinh:
        case EOpAcosh:
        case EOpAtanh:

        case EOpFloatBitsToInt:
        case EOpFloatBitsToUint:
        case EOpIntBitsToFloat:
        case EOpUintBitsToFloat:
        case EOpDoubleBitsToInt64:
        case EOpDoubleBitsToUint64:
        case EOpInt64BitsToDouble:
        case EOpUint64BitsToDouble:
        case EOpFloat16BitsToInt16:
        case EOpFloat16BitsToUint16:
        case EOpInt16BitsToFloat16:
        case EOpUint16BitsToFloat16:
        default:
            return nullptr;
        }
    }

    TIntermConstantUnion *newNode = new TIntermConstantUnion(newConstArray, returnType);
    newNode->getWritableType().getQualifier().storage = EvqConst;
    newNode->setLoc(getLoc());

    return newNode;
}